

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTendonAnchor::IfcTendonAnchor(IfcTendonAnchor *this)

{
  *(undefined ***)&(this->super_IfcReinforcingElement).field_0x1a0 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x1a8 = 0;
  *(char **)&this->field_0x1b0 = "IfcTendonAnchor";
  Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            (&this->super_IfcReinforcingElement,&PTR_construction_vtable_24__0088a868);
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x88a6e8;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x1a0 = 0x88a850;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x88a710;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x88a738;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x88a760;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x88a788;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0x88a7b0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x88a7d8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = 0x88a800;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x190 = 0x88a828;
  return;
}

Assistant:

IfcTendonAnchor() : Object("IfcTendonAnchor") {}